

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

uint * __thiscall
google::protobuf::Map<unsigned_int,_unsigned_int>::at<unsigned_int>
          (Map<unsigned_int,_unsigned_int> *this,key_arg<unsigned_int> *key)

{
  LogMessage *this_00;
  NodeAndBucket NVar1;
  LogMessage local_20;
  
  NVar1 = internal::KeyMapBase<unsigned_int>::FindHelper(&this->super_KeyMapBase<unsigned_int>,*key)
  ;
  if (NVar1.node != (NodeBase *)0x0) {
    return (uint *)((long)&NVar1.node[1].next + 4);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x4e8,"it != end()");
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_20,(char (*) [16])"key not found: ");
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,*key);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

const T& at(const key_arg<K>& key) const ABSL_ATTRIBUTE_LIFETIME_BOUND {
    const_iterator it = find(key);
    ABSL_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }